

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O1

int nn_ins_bind(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  nn_list_item *pnVar2;
  nn_list_item *pnVar3;
  char *pcVar4;
  char *pcVar5;
  nn_ins_item *self;
  
  nn_mutex_lock(&::self.sync);
  pnVar2 = nn_list_begin(&::self.bound);
  pnVar3 = nn_list_end(&::self.bound);
  if (pnVar2 != pnVar3) {
    do {
      pnVar3 = pnVar2 + -1;
      if (pnVar2 == (nn_list_item *)0x0) {
        pnVar3 = (nn_list_item *)0x0;
      }
      pcVar4 = nn_epbase_getaddr(&item->epbase);
      pcVar5 = nn_epbase_getaddr((nn_epbase *)pnVar3);
      iVar1 = strncmp(pcVar4,pcVar5,0x80);
      if (iVar1 == 0) {
        iVar1 = -0x62;
        goto LAB_00129988;
      }
      pnVar2 = nn_list_next(&::self.bound,pnVar2);
      pnVar3 = nn_list_end(&::self.bound);
    } while (pnVar2 != pnVar3);
  }
  pnVar3 = nn_list_end(&::self.bound);
  nn_list_insert(&::self.bound,&item->item,pnVar3);
  pnVar2 = nn_list_begin(&::self.connected);
  pnVar3 = nn_list_end(&::self.connected);
  iVar1 = 0;
  if (pnVar2 != pnVar3) {
    do {
      self = (nn_ins_item *)(pnVar2 + -1);
      if (pnVar2 == (nn_list_item *)0x0) {
        self = (nn_ins_item *)0x0;
      }
      pcVar4 = nn_epbase_getaddr(&item->epbase);
      pcVar5 = nn_epbase_getaddr(&self->epbase);
      iVar1 = strncmp(pcVar4,pcVar5,0x80);
      if ((iVar1 == 0) && (iVar1 = nn_epbase_ispeer(&item->epbase,self->protocol), iVar1 != 0)) {
        (*fn)(item,self);
      }
      pnVar2 = nn_list_next(&::self.connected,pnVar2);
      pnVar3 = nn_list_end(&::self.connected);
    } while (pnVar2 != pnVar3);
    iVar1 = 0;
  }
LAB_00129988:
  nn_mutex_unlock(&::self.sync);
  return iVar1;
}

Assistant:

int nn_ins_bind (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;
    struct nn_ins_item *citem;

    nn_mutex_lock (&self.sync);

    /*  Check whether the endpoint isn't already bound. */
    /*  TODO:  This is an O(n) algorithm! */
    for (it = nn_list_begin (&self.bound); it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_epbase_getaddr (&item->epbase),
              nn_epbase_getaddr (&bitem->epbase), NN_SOCKADDR_MAX) == 0) {
            nn_mutex_unlock (&self.sync);
            return -EADDRINUSE;
        }
    }

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.bound, &item->item,
        nn_list_end (&self.bound));

    /*  During this process new pipes may be created. */
    for (it = nn_list_begin (&self.connected);
          it != nn_list_end (&self.connected);
          it = nn_list_next (&self.connected, it)) {
        citem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_epbase_getaddr (&item->epbase),
              nn_epbase_getaddr (&citem->epbase), NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_epbase_ispeer (&item->epbase, citem->protocol))
                continue;

            fn (item, citem);
        }
    }

    nn_mutex_unlock (&self.sync);

    return 0;
}